

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O2

int __thiscall ser::OffsetTable::GetSavepointID(OffsetTable *this,Savepoint *savepoint)

{
  int iVar1;
  const_iterator cVar2;
  
  cVar2 = std::
          _Rb_tree<ser::Savepoint,_std::pair<const_ser::Savepoint,_int>,_std::_Select1st<std::pair<const_ser::Savepoint,_int>_>,_std::less<ser::Savepoint>,_std::allocator<std::pair<const_ser::Savepoint,_int>_>_>
          ::find(&(this->savepointIndex_)._M_t,savepoint);
  if ((_Rb_tree_header *)cVar2._M_node ==
      &(this->savepointIndex_)._M_t._M_impl.super__Rb_tree_header) {
    iVar1 = -1;
  }
  else {
    iVar1 = *(int *)&cVar2._M_node[3]._M_left;
  }
  return iVar1;
}

Assistant:

int OffsetTable::GetSavepointID(const Savepoint& savepoint) const
{
    std::map<Savepoint, int>::const_iterator iter = savepointIndex_.find(savepoint);
    return (iter == savepointIndex_.end() ? -1 : iter->second);
}